

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_segment.cpp
# Opt level: O3

void __thiscall duckdb::TupleDataChunk::Verify(TupleDataChunk *this,TupleDataSegment *segment)

{
  return;
}

Assistant:

void TupleDataChunk::Verify(const TupleDataSegment &segment) const {
#ifdef DEBUG
	idx_t total_count = 0;
	for (auto part_id = part_ids.Start(); part_id < part_ids.End(); part_id++) {
		total_count += segment.chunk_parts[part_id].count;
	}
	D_ASSERT(this->count == total_count);
	D_ASSERT(this->count <= STANDARD_VECTOR_SIZE);
#endif
}